

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O0

void ggml_compute_forward_im2col(ggml_compute_params *params,ggml_tensor *dst)

{
  int *in_RSI;
  ggml_tensor *in_stack_000001b8;
  ggml_compute_params *in_stack_000001c0;
  ggml_tensor *in_stack_000001e8;
  ggml_compute_params *in_stack_000001f0;
  
  if (*in_RSI == 0) {
    ggml_compute_forward_im2col_f32(in_stack_000001c0,in_stack_000001b8);
  }
  else if (*in_RSI == 1) {
    ggml_compute_forward_im2col_f16(in_stack_000001f0,in_stack_000001e8);
  }
  else {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ops.cpp"
               ,0x16ef,"fatal error");
  }
  return;
}

Assistant:

void ggml_compute_forward_im2col(
        const ggml_compute_params * params,
              ggml_tensor * dst) {
    switch (dst->type) {
        case GGML_TYPE_F16:
            {
                ggml_compute_forward_im2col_f16(params, dst);
            } break;
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_im2col_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}